

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::GLES2Context::GLES2Context
          (GLES2Context *this,SharedPtr<tcu::ThreadUtil::Event> *event,
          SharedPtr<deqp::egl::GLES2ThreadTest::GLES2ResourceManager> *resourceManager_)

{
  SharedPtr<tcu::ThreadUtil::Event> local_30;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2ResourceManager> *local_20;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2ResourceManager> *resourceManager__local;
  SharedPtr<tcu::ThreadUtil::Event> *event_local;
  GLES2Context *this_local;
  
  local_20 = resourceManager_;
  resourceManager__local = (SharedPtr<deqp::egl::GLES2ThreadTest::GLES2ResourceManager> *)event;
  event_local = (SharedPtr<tcu::ThreadUtil::Event> *)this;
  de::SharedPtr<tcu::ThreadUtil::Event>::SharedPtr(&local_30,event);
  tcu::ThreadUtil::Object::Object(&this->super_Object,"Context",&local_30);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr(&local_30);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__GLES2Context_03267408;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2ResourceManager>::SharedPtr
            (&this->resourceManager,resourceManager_);
  this->display = (EGLDisplay)0x0;
  this->context = (EGLContext)0x0;
  (this->glExtensions).imageTargetTexture2D = (glEGLImageTargetTexture2DOESFunc)0x0;
  return;
}

Assistant:

GLES2Context::GLES2Context (SharedPtr<tcu::ThreadUtil::Event> event, SharedPtr<GLES2ResourceManager> resourceManager_)
	: tcu::ThreadUtil::Object	("Context", event)
	, resourceManager			(resourceManager_)
	, display					(EGL_NO_DISPLAY)
	, context					(EGL_NO_CONTEXT)
{
	glExtensions.imageTargetTexture2D = DE_NULL;
}